

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

void __thiscall ON_Xform::ON_Xform(ON_Xform *this,float *m)

{
  undefined8 uVar1;
  
  uVar1 = *(undefined8 *)m;
  this->m_xform[0][0] = (double)(float)uVar1;
  this->m_xform[0][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m + 2);
  this->m_xform[0][2] = (double)(float)uVar1;
  this->m_xform[0][3] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m + 4);
  this->m_xform[1][0] = (double)(float)uVar1;
  this->m_xform[1][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m + 6);
  this->m_xform[1][2] = (double)(float)uVar1;
  this->m_xform[1][3] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m + 8);
  this->m_xform[2][0] = (double)(float)uVar1;
  this->m_xform[2][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m + 10);
  this->m_xform[2][2] = (double)(float)uVar1;
  this->m_xform[2][3] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m + 0xc);
  this->m_xform[3][0] = (double)(float)uVar1;
  this->m_xform[3][1] = (double)(float)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(m + 0xe);
  this->m_xform[3][2] = (double)(float)uVar1;
  this->m_xform[3][3] = (double)(float)((ulong)uVar1 >> 0x20);
  return;
}

Assistant:

ON_Xform::ON_Xform( const float* m )
{
  m_xform[0][0] = (double)m[0];
  m_xform[0][1] = (double)m[1];
  m_xform[0][2] = (double)m[2];
  m_xform[0][3] = (double)m[3];

  m_xform[1][0] = (double)m[4];
  m_xform[1][1] = (double)m[5];
  m_xform[1][2] = (double)m[6];
  m_xform[1][3] = (double)m[7];

  m_xform[2][0] = (double)m[8];
  m_xform[2][1] = (double)m[9];
  m_xform[2][2] = (double)m[10];
  m_xform[2][3] = (double)m[11];

  m_xform[3][0] = (double)m[12];
  m_xform[3][1] = (double)m[13];
  m_xform[3][2] = (double)m[14];
  m_xform[3][3] = (double)m[15];
}